

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_0::genFrgShaderSrc
                   (string *__return_storage_ptr__,deUint32 seed,
                   vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   *inputs,string *varName,bool uniform,float value)

{
  bool bVar1;
  reference decl;
  ostream *poVar2;
  size_type sVar3;
  const_reference input;
  float fVar4;
  ulong local_1e0;
  size_t i;
  __normal_iterator<const_glu::VariableDeclaration_*,_std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>_>
  local_1d0;
  const_iterator it;
  long local_1b8;
  ostringstream oss;
  undefined1 local_40 [8];
  Random rnd;
  float value_local;
  bool uniform_local;
  string *varName_local;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *inputs_local;
  deUint32 seed_local;
  
  rnd.m_rnd.z = (deUint32)value;
  rnd.m_rnd.w._3_1_ = uniform;
  de::Random::Random((Random *)local_40,seed);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
  std::ios_base::precision((ios_base *)((long)&local_1b8 + *(long *)(local_1b8 + -0x18)),4);
  std::ios_base::width((ios_base *)((long)&local_1b8 + *(long *)(local_1b8 + -0x18)),7);
  std::operator<<((ostream *)&local_1b8,"#version 310 es\n");
  std::operator<<((ostream *)&local_1b8,"precision highp float;\n");
  std::operator<<((ostream *)&local_1b8,"out vec4 fragColor;\n");
  printFloatDeclaration
            ((ostringstream *)&local_1b8,varName,(bool)(rnd.m_rnd.w._3_1_ & 1),(GLfloat)rnd.m_rnd.z)
  ;
  local_1d0._M_current =
       (VariableDeclaration *)
       std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::begin
                 (inputs);
  while( true ) {
    i = (size_t)std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
                end(inputs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1d0,
                       (__normal_iterator<const_glu::VariableDeclaration_*,_std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>_>
                        *)&i);
    if (!bVar1) break;
    decl = __gnu_cxx::
           __normal_iterator<const_glu::VariableDeclaration_*,_std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>_>
           ::operator*(&local_1d0);
    poVar2 = glu::operator<<((ostream *)&local_1b8,decl);
    std::operator<<(poVar2,";\n");
    __gnu_cxx::
    __normal_iterator<const_glu::VariableDeclaration_*,_std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>_>
    ::operator++(&local_1d0);
  }
  poVar2 = std::operator<<((ostream *)&local_1b8,"int imod (int n, int d)");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"{");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2,"return (n < 0 ? d - 1 - (-1 - n) % d : n % d);");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&local_1b8,"vec4 hsv (vec3 hsv)");
  poVar2 = std::operator<<(poVar2,"{");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tfloat h = hsv.x * 3.0;\n");
  poVar2 = std::operator<<(poVar2,"\tfloat r = max(0.0, 1.0 - h) + max(0.0, h - 2.0);\n");
  poVar2 = std::operator<<(poVar2,"\tfloat g = max(0.0, 1.0 - abs(h - 1.0));\n");
  poVar2 = std::operator<<(poVar2,"\tfloat b = max(0.0, 1.0 - abs(h - 2.0));\n");
  poVar2 = std::operator<<(poVar2,"\tvec3 hs = mix(vec3(1.0), vec3(r, g, b), hsv.y);\n");
  poVar2 = std::operator<<(poVar2,"\treturn vec4(hsv.z * hs, 1.0);\n");
  std::operator<<(poVar2,"}\n");
  poVar2 = std::operator<<((ostream *)&local_1b8,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<((ostream *)&local_1b8,"\t");
  poVar2 = std::operator<<(poVar2,"fragColor = vec4(vec3(");
  poVar2 = std::operator<<(poVar2,(string *)varName);
  poVar2 = std::operator<<(poVar2,"), 1.0);");
  std::operator<<(poVar2,"\n");
  sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                    (inputs);
  if (sVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t");
    std::operator<<(poVar2,"switch (imod(int(0.5 * (");
    fVar4 = de::Random::getFloat((Random *)local_40,0.5,2.0);
    printFloat((ostringstream *)&local_1b8,(double)fVar4);
    std::operator<<((ostream *)&local_1b8," * gl_FragCoord.x - ");
    fVar4 = de::Random::getFloat((Random *)local_40,0.5,2.0);
    printFloat((ostringstream *)&local_1b8,(double)fVar4);
    poVar2 = std::operator<<((ostream *)&local_1b8," * gl_FragCoord.y)), ");
    sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                      (inputs);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2,"))");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,"{");
    std::operator<<(poVar2,"\n");
    local_1e0 = 0;
    while( true ) {
      sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                        (inputs);
      if (sVar3 <= local_1e0) break;
      poVar2 = std::operator<<((ostream *)&local_1b8,"\t\t");
      poVar2 = std::operator<<(poVar2,"case ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e0);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"\t\t\t");
      std::operator<<(poVar2,"fragColor *= ");
      input = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::
              operator[](inputs,local_1e0);
      printInputColor((ostringstream *)&local_1b8,input);
      poVar2 = std::operator<<((ostream *)&local_1b8,";");
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"\t\t\t");
      poVar2 = std::operator<<(poVar2,"break;");
      std::operator<<(poVar2,"\n");
      local_1e0 = local_1e0 + 1;
    }
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t\t");
    poVar2 = std::operator<<(poVar2,"case ");
    sVar3 = std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::size
                      (inputs);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"\t\t\t");
    poVar2 = std::operator<<(poVar2,"fragColor = vec4(1.0, 0.0, 1.0, 1.0);");
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t\t\t");
    poVar2 = std::operator<<(poVar2,"break;");
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t\t");
    poVar2 = std::operator<<(poVar2,"case -1:\n");
    poVar2 = std::operator<<(poVar2,"\t\t\t");
    poVar2 = std::operator<<(poVar2,"fragColor = vec4(1.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t\t\t");
    poVar2 = std::operator<<(poVar2,"break;");
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t\t");
    poVar2 = std::operator<<(poVar2,"default:");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\t\t\t");
    poVar2 = std::operator<<(poVar2,"fragColor = vec4(1.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&local_1b8,"\t");
    std::operator<<(poVar2,"}\n");
  }
  std::operator<<((ostream *)&local_1b8,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
  de::Random::~Random((Random *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string genFrgShaderSrc (deUint32							seed,
						const vector<VariableDeclaration>&	inputs,
						const string&						varName,
						bool								uniform,
						float								value = 0.0)
{
	Random				rnd		(seed);
	ostringstream		oss;

	oss.precision(4);
	oss.width(7);
	oss << "#version 310 es\n";

	oss << "precision highp float;\n";

	oss << "out vec4 fragColor;\n";

	printFloatDeclaration(oss, varName, uniform, value);

	for (vector<VariableDeclaration>::const_iterator it = inputs.begin();
		 it != inputs.end(); ++it)
		oss << *it << ";\n";

	// glsl % isn't defined for negative numbers
	oss << "int imod (int n, int d)" << "\n"
		<< "{" << "\n"
		<< "\t" << "return (n < 0 ? d - 1 - (-1 - n) % d : n % d);" << "\n"
		<< "}" << "\n";

	oss << "vec4 hsv (vec3 hsv)"
		<< "{" << "\n"
		<< "\tfloat h = hsv.x * 3.0;\n"
		<< "\tfloat r = max(0.0, 1.0 - h) + max(0.0, h - 2.0);\n"
		<< "\tfloat g = max(0.0, 1.0 - abs(h - 1.0));\n"
		<< "\tfloat b = max(0.0, 1.0 - abs(h - 2.0));\n"
		<< "\tvec3 hs = mix(vec3(1.0), vec3(r, g, b), hsv.y);\n"
		<< "\treturn vec4(hsv.z * hs, 1.0);\n"
		<< "}\n";

	oss << "void main (void)\n"
		<< "{\n";

	oss << "\t" << "fragColor = vec4(vec3(" << varName << "), 1.0);" << "\n";

	if (inputs.size() > 0)
	{
		oss << "\t"
			<< "switch (imod(int(0.5 * (";

		printFloat(oss, rnd.getFloat(0.5f, 2.0f));
		oss << " * gl_FragCoord.x - ";

		printFloat(oss, rnd.getFloat(0.5f, 2.0f));
		oss << " * gl_FragCoord.y)), "
			<< inputs.size() << "))" << "\n"
			<< "\t" << "{" << "\n";

		for (size_t i = 0; i < inputs.size(); ++i)
		{
			oss << "\t\t" << "case " << i << ":" << "\n"
				<< "\t\t\t" << "fragColor *= ";

			printInputColor(oss, inputs[i]);

			oss << ";" << "\n"
				<< "\t\t\t" << "break;" << "\n";
		}

		oss << "\t\t" << "case " << inputs.size() << ":\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 0.0, 1.0, 1.0);" << "\n";
		oss << "\t\t\t" << "break;" << "\n";

		oss << "\t\t" << "case -1:\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 1.0, 0.0, 1.0);" << "\n";
		oss << "\t\t\t" << "break;" << "\n";

		oss << "\t\t" << "default:" << "\n"
			<< "\t\t\t" << "fragColor = vec4(1.0, 1.0, 0.0, 1.0);" << "\n";

		oss << "\t" << "}\n";

	}

	oss << "}\n";

	return oss.str();
}